

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O3

void __thiscall soul::RenderingVenue::Pimpl::removeActiveSession(Pimpl *this,SessionImpl *session)

{
  __normal_iterator<soul::RenderingVenue::Pimpl::SessionImpl_**,_std::vector<soul::RenderingVenue::Pimpl::SessionImpl_*,_std::allocator<soul::RenderingVenue::Pimpl::SessionImpl_*>_>_>
  __last;
  int iVar1;
  __normal_iterator<soul::RenderingVenue::Pimpl::SessionImpl_**,_std::vector<soul::RenderingVenue::Pimpl::SessionImpl_*,_std::allocator<soul::RenderingVenue::Pimpl::SessionImpl_*>_>_>
  __dest;
  __normal_iterator<soul::RenderingVenue::Pimpl::SessionImpl_**,_std::vector<soul::RenderingVenue::Pimpl::SessionImpl_*,_std::allocator<soul::RenderingVenue::Pimpl::SessionImpl_*>_>_>
  _Var2;
  size_t __n;
  SessionImpl **ppSVar3;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->sessionListLock);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  __last._M_current =
       (this->activeSessions).
       super__Vector_base<soul::RenderingVenue::Pimpl::SessionImpl_*,_std::allocator<soul::RenderingVenue::Pimpl::SessionImpl_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  __dest = std::
           __remove_if<__gnu_cxx::__normal_iterator<soul::RenderingVenue::Pimpl::SessionImpl**,std::vector<soul::RenderingVenue::Pimpl::SessionImpl*,std::allocator<soul::RenderingVenue::Pimpl::SessionImpl*>>>,__gnu_cxx::__ops::_Iter_pred<soul::RenderingVenue::Pimpl::removeActiveSession(soul::RenderingVenue::Pimpl::SessionImpl&)::_lambda(soul::RenderingVenue::Pimpl::SessionImpl*)_1_>>
                     ((__normal_iterator<soul::RenderingVenue::Pimpl::SessionImpl_**,_std::vector<soul::RenderingVenue::Pimpl::SessionImpl_*,_std::allocator<soul::RenderingVenue::Pimpl::SessionImpl_*>_>_>
                       )(this->activeSessions).
                        super__Vector_base<soul::RenderingVenue::Pimpl::SessionImpl_*,_std::allocator<soul::RenderingVenue::Pimpl::SessionImpl_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,__last,
                      (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonhochrein[P]soul_lsp_vendor_SOUL_source_modules_soul_core_venue_soul_RenderingVenue_cpp:489:35)>
                       )session);
  if (__dest._M_current != __last._M_current) {
    __n = (long)(this->activeSessions).
                super__Vector_base<soul::RenderingVenue::Pimpl::SessionImpl_*,_std::allocator<soul::RenderingVenue::Pimpl::SessionImpl_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)__last._M_current;
    _Var2._M_current = __last._M_current;
    if (__n != 0) {
      memmove(__dest._M_current,__last._M_current,__n);
      _Var2._M_current =
           (this->activeSessions).
           super__Vector_base<soul::RenderingVenue::Pimpl::SessionImpl_*,_std::allocator<soul::RenderingVenue::Pimpl::SessionImpl_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    ppSVar3 = __dest._M_current + ((long)_Var2._M_current - (long)__last._M_current);
    if (_Var2._M_current != ppSVar3) {
      (this->activeSessions).
      super__Vector_base<soul::RenderingVenue::Pimpl::SessionImpl_*,_std::allocator<soul::RenderingVenue::Pimpl::SessionImpl_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppSVar3;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->sessionListLock);
  return;
}

Assistant:

void removeActiveSession (SessionImpl& session)
    {
        std::lock_guard<std::mutex> l (sessionListLock);
        removeIf (activeSessions, [&] (SessionImpl* s) { return s == std::addressof (session); });
    }